

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int SplitString(char *str,char **tokens,int maxTokens)

{
  char *pcVar1;
  char *token;
  int i;
  int maxTokens_local;
  char **tokens_local;
  char *str_local;
  
  token._0_4_ = 0;
  tokens_local = (char **)str;
  while( true ) {
    if (maxTokens <= (int)token) {
      return (int)token;
    }
    pcVar1 = strtok((char *)tokens_local," \t\n");
    tokens_local = (char **)0x0;
    tokens[(int)token] = pcVar1;
    if (pcVar1 == (char *)0x0) break;
    token._0_4_ = (int)token + 1;
  }
  return (int)token;
}

Assistant:

int SplitString(char* str, char* tokens[], const int maxTokens)
{
    int i = 0;
    for(i = 0; i < maxTokens; i++)
    {
        char* token = strtok(str, " \t\n");
        str = NULL;
        tokens[i] = token;
        if(token == NULL)
        {
            break;
        }
    }
    return i;
}